

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O3

map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
* dominac_frontier(map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *__return_storage_ptr__,
                  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *dom,
                  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  *nodes)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  int iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  _Base_ptr p_Var9;
  int runner;
  vector<int,_std::allocator<int>_> b;
  _Self __tmp;
  int local_7c;
  void *local_78;
  iterator iStack_70;
  int *local_68;
  map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  *local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  ulong local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = (dom->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50 = &(dom->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (local_48 != local_50) {
    local_58 = &(nodes->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_60 = nodes;
    do {
      p_Var5 = (local_60->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var9 = local_58;
      if (p_Var5 != (_Base_ptr)0x0) {
        _Var2 = local_48[1]._M_color;
        p_Var4 = local_58;
        do {
          if ((int)_Var2 <= (int)p_Var5[1]._M_color) {
            p_Var4 = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < (int)_Var2];
        } while (p_Var5 != (_Base_ptr)0x0);
        if ((p_Var4 != local_58) && (p_Var9 = p_Var4, (int)_Var2 < (int)p_Var4[1]._M_color)) {
          p_Var9 = local_58;
        }
      }
      p_Var5 = p_Var9[1]._M_parent[1]._M_right;
      if (8 < (ulong)(*(long *)(p_Var9[1]._M_parent + 2) - (long)p_Var5)) {
        p_Var4 = p_Var9 + 1;
        uVar8 = 0;
        local_40 = p_Var9;
        do {
          local_7c = **(int **)(&p_Var5->_M_color + uVar8 * 2);
          local_38 = uVar8;
          pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[](dom,(key_type *)p_Var4);
          iVar3 = *pmVar6;
          while (local_7c != iVar3) {
            p_Var5 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
            p_Var9 = &p_Var1->_M_header;
            if (p_Var5 == (_Base_ptr)0x0) {
LAB_0019233c:
              local_78 = (void *)0x0;
              iStack_70._M_current = (int *)0x0;
              local_68 = (int *)0x0;
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_78,(iterator)0x0,(int *)p_Var4);
              pmVar7 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](__return_storage_ptr__,&local_7c);
              std::vector<int,_std::allocator<int>_>::operator=
                        (pmVar7,(vector<int,_std::allocator<int>_> *)&local_78);
            }
            else {
              do {
                if (local_7c <= (int)*(size_t *)(p_Var5 + 1)) {
                  p_Var9 = p_Var5;
                }
                p_Var5 = (&p_Var5->_M_left)[(int)*(size_t *)(p_Var5 + 1) < local_7c];
              } while (p_Var5 != (_Base_ptr)0x0);
              if (((_Rb_tree_header *)p_Var9 == p_Var1) ||
                 (local_7c < (int)((_Rb_tree_header *)p_Var9)->_M_node_count)) goto LAB_0019233c;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_78,
                         (vector<int,_std::allocator<int>_> *)((long)p_Var9 + 0x28));
              if (iStack_70._M_current == local_68) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_78,iStack_70,(int *)p_Var4);
              }
              else {
                *iStack_70._M_current = p_Var4->_M_color;
                iStack_70._M_current = iStack_70._M_current + 1;
              }
              pmVar7 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](__return_storage_ptr__,&local_7c);
              std::vector<int,_std::allocator<int>_>::operator=
                        (pmVar7,(vector<int,_std::allocator<int>_> *)&local_78);
            }
            if (local_78 != (void *)0x0) {
              operator_delete(local_78,(long)local_68 - (long)local_78);
            }
            pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[](dom,&local_7c);
            local_7c = *pmVar6;
          }
          uVar8 = local_38 + 1;
          p_Var5 = local_40[1]._M_parent[1]._M_right;
        } while (uVar8 < (ulong)(*(long *)(local_40[1]._M_parent + 2) - (long)p_Var5 >> 3));
      }
      local_48 = (_Base_ptr)std::_Rb_tree_increment(local_48);
    } while (local_48 != local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

map<int, vector<int>> dominac_frontier(map<int, int> dom,
                                       map<int, BasicBlock*> nodes) {
  map<int, vector<int>> dom_f;
  map<int, int>::iterator iter;
  for (iter = dom.begin(); iter != dom.end(); iter++) {
    map<int, BasicBlock*>::iterator it = nodes.find(iter->first);
    if (it->second->preBlock.size() > 1) {
      for (int i = 0; i < it->second->preBlock.size(); i++) {
        int runner = it->second->preBlock[i]->id;
        map<int, vector<int>>::iterator itt;
        int idom_b = dom[it->first];
        while (runner != idom_b) {
          // add b to runner's dominance frontier set
          itt = dom_f.find(runner);
          if (itt == dom_f.end()) {
            vector<int> b;
            b.push_back(it->first);
            dom_f[runner] = b;
          } else {
            vector<int> b = itt->second;
            b.push_back(it->first);
            dom_f[runner] = b;
          }
          // runner := idom(runner)
          runner = dom[runner];
        }
      }
    }
  }
  map<int, vector<int>>::iterator i;
  /*cout << endl << "*** desplay dominac frontier ***" << endl;
  for (i = dom_f.begin(); i != dom_f.end(); i++) {
      cout << i->first;
      for (int j = 0; j < i->second.size(); j++) {
          cout << " " << i->second[j];
      }
      cout << endl;
  }*/
  return dom_f;
}